

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_0::TessCoordComponent::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition caseDef)

{
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  undefined8 *puVar2;
  TestLog *pTVar3;
  undefined8 uVar4;
  VkDeviceSize size;
  TestStatus *pTVar5;
  Allocation *pAVar6;
  char cVar7;
  deUint32 queueFamilyIndex;
  int iVar8;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  DescriptorSetUpdateBuilder *this_01;
  GraphicsPipelineBuilder *pGVar9;
  ProgramBinary *pPVar10;
  TessPrimitiveType primitiveType;
  code *pcVar11;
  Vector<float,_3> *value;
  int iVar12;
  DeviceInterface *vk;
  long lVar13;
  Context *pCVar14;
  VkDevice pVVar15;
  code *pcVar16;
  de *this_02;
  bool bVar17;
  float fVar18;
  allocator<char> local_45b;
  allocator<char> local_45a;
  allocator<char> local_459;
  VkDevice local_458;
  VkDeviceSize local_450;
  RefBase<vk::VkCommandBuffer_s_*> local_448;
  Context *local_428;
  DeviceInterface *local_420;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_418;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  string local_3d8;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_398;
  TestStatus *local_378;
  VkQueue local_370;
  long local_368;
  long local_360;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_358;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_338;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_318;
  string local_2f0;
  VkDescriptorBufferInfo resultBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2b8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_298;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_278;
  Buffer resultBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  undefined8 uStack_210;
  deUint32 local_12c;
  bool local_128;
  VkPrimitiveTopology local_124;
  string local_a8;
  Buffer vertexBuffer;
  undefined1 local_58 [40];
  
  local_378 = __return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  local_420 = Context::getDeviceInterface(context);
  local_458 = Context::getDevice(context);
  local_370 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_428 = context;
  allocator = Context::getDefaultAllocator(context);
  deRandom_init((deRandom *)&vertexBuffer,0x7b);
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar12 = 0x20;
  while (bVar17 = iVar12 != 0, iVar12 = iVar12 + -1, bVar17) {
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,fVar18 * 62.0 + 1.0);
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    vertexBufferOffset = CONCAT44(fVar18 * 62.0 + 1.0,(undefined4)vertexBufferOffset);
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    uStack_220._0_4_ = fVar18 * 62.0 + 1.0;
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    uStack_220._4_4_ = fVar18 * 62.0 + 1.0;
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    local_218 = fVar18 * 62.0 + 1.0;
    fVar18 = deRandom_getFloat((deRandom *)&vertexBuffer);
    fStack_214 = fVar18 * 62.0 + 1.0;
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    push_back(&tessLevelCases,(value_type *)&vertexBufferOffset);
  }
  iVar12 = 0;
  for (lVar13 = 8; lVar13 != 0x308; lVar13 = lVar13 + 0x18) {
    iVar8 = referenceVertexCount
                      (caseDef.primitiveType,caseDef.spacingMode,caseDef.usePointMode,
                       (float *)((long)(tessLevelCases.
                                        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->inner +
                                lVar13 + -8),
                       (float *)((long)(tessLevelCases.
                                        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->inner + lVar13))
    ;
    if (iVar12 <= iVar8) {
      iVar12 = iVar8;
    }
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,(ulong)(stride * 6),0x80);
  vk = local_420;
  tessellation::Buffer::Buffer
            (&vertexBuffer,local_420,local_458,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  local_450 = (long)(iVar12 + 4) * 0x10 + 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,local_450,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,local_458,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  this = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                   ((DescriptorSetLayoutBuilder *)&vertexBufferOffset,
                    VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_358,this,vk,local_458,0);
  local_318.m_data.deleter.m_device = local_358.m_data.deleter.m_device;
  local_318.m_data.deleter.m_allocator = local_358.m_data.deleter.m_allocator;
  local_318.m_data.object.m_internal = local_358.m_data.object.m_internal;
  local_318.m_data.deleter.m_deviceIface = local_358.m_data.deleter.m_deviceIface;
  local_358.m_data.object.m_internal = 0;
  local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_358.m_data.deleter.m_device = (VkDevice)0x0;
  local_358.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_358);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_418);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_418,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pVVar15 = local_458;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset,this_00,vk,local_458,1,1);
  local_358.m_data.deleter.m_device = (VkDevice)_local_218;
  local_358.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uStack_210;
  local_358.m_data.object.m_internal = vertexBufferOffset;
  local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_418);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset,vk,pVVar15,
                    (VkDescriptorPool)local_358.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_318.m_data.object.m_internal);
  local_418.m_data.deleter.m_device = (VkDevice)_local_218;
  local_418.m_data.deleter.m_pool.m_internal = uStack_210;
  local_418.m_data.object.m_internal = vertexBufferOffset;
  local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset);
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = local_450;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  local_398.m_data.object.m_internal._0_4_ = 0;
  local_398.m_data.object.m_internal._4_4_ = 0;
  this_01 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&vertexBufferOffset,
                       (VkDescriptorSet)local_418.m_data.object.m_internal,(Location *)&local_398,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultBufferInfo);
  pVVar15 = local_458;
  ::vk::DescriptorSetUpdateBuilder::update(this_01,vk,local_458);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset,vk,pVVar15);
  local_398.m_data.deleter.m_device = (VkDevice)_local_218;
  local_398.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uStack_210;
  local_398.m_data.object.m_internal = vertexBufferOffset;
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,vk,pVVar15,
             (VkRenderPass)local_398.m_data.object.m_internal);
  local_278.m_data.deleter.m_device = (VkDevice)_local_218;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uStack_210;
  local_278.m_data.object.m_internal = vertexBufferOffset;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset,vk,pVVar15,
                     (VkDescriptorSetLayout)local_318.m_data.object.m_internal);
  local_338.m_data.deleter.m_device = (VkDevice)_local_218;
  local_338.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uStack_210;
  local_338.m_data.object.m_internal = vertexBufferOffset;
  local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset,vk,pVVar15,
                  queueFamilyIndex);
  local_298.m_data.deleter.m_device = (VkDevice)_local_218;
  local_298.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uStack_210;
  local_298.m_data.object.m_internal = vertexBufferOffset;
  local_298.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset,vk,pVVar15,
             (VkCommandPool)local_298.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pCVar14 = local_428;
  local_448.m_data.deleter.m_device = (VkDevice)_local_218;
  local_448.m_data.deleter.m_pool.m_internal = uStack_210;
  local_448.m_data.object = (VkCommandBuffer_s *)vertexBufferOffset;
  local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)uStack_220;
  vertexBufferOffset = 0;
  uStack_220 = 0;
  _local_218 = (pointer)0x0;
  uStack_210 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset);
  memset((GraphicsPipelineBuilder *)&vertexBufferOffset,0,0xfc);
  local_128 = false;
  local_124 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_12c = 6;
  pGVar9 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     ((GraphicsPipelineBuilder *)&vertexBufferOffset,VK_FORMAT_R32_SFLOAT,stride);
  pPVar1 = pCVar14->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&vertices,"vert",&local_459);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&vertices);
  pGVar9 = GraphicsPipelineBuilder::setShader
                     (pGVar9,vk,pVVar15,VK_SHADER_STAGE_VERTEX_BIT,pPVar10,
                      (VkSpecializationInfo *)0x0);
  pPVar1 = pCVar14->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"tesc",&local_45a);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_2f0);
  pGVar9 = GraphicsPipelineBuilder::setShader
                     (pGVar9,vk,pVVar15,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar10,
                      (VkSpecializationInfo *)0x0);
  pPVar1 = pCVar14->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"tese",&local_45b);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,&local_a8);
  pGVar9 = GraphicsPipelineBuilder::setShader
                     (pGVar9,vk,pVVar15,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar10,
                      (VkSpecializationInfo *)0x0);
  pcVar11 = (code *)pVVar15;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_3d8,pGVar9,vk,pVVar15,
             (VkPipelineLayout)local_338.m_data.object.m_internal,
             (VkRenderPass)local_398.m_data.object.m_internal);
  local_2b8.m_data.deleter.m_device = (VkDevice)local_3d8.field_2._M_allocated_capacity;
  local_2b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_3d8.field_2._8_8_;
  local_2b8.m_data.object.m_internal = (deUint64)local_3d8._M_dataplus._M_p;
  local_2b8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_3d8._M_string_length;
  local_3d8._M_dataplus._M_p = (pointer)0x0;
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_allocated_capacity = 0;
  local_3d8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&vertices);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&vertexBufferOffset);
  lVar13 = 0;
  local_360 = (ulong)(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) + 2;
  while( true ) {
    primitiveType = (TessPrimitiveType)pcVar11;
    if (lVar13 == 0x20) break;
    vertexBufferOffset = (VkDeviceSize)pCVar14->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_220);
    std::operator<<((ostream *)&uStack_220,"Testing with tessellation levels: ");
    local_368 = lVar13;
    getTessellationLevelsString_abi_cxx11_
              (&local_3d8,
               (tessellation *)
               (tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar13),
               (TessLevels *)(ulong)caseDef.primitiveType,primitiveType);
    std::operator<<((ostream *)&uStack_220,(string *)&local_3d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_220);
    puVar2 = (undefined8 *)
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar2[2] = *(undefined8 *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar13].outer + 2);
    uVar4 = *(undefined8 *)
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13].outer;
    *puVar2 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar13].inner;
    puVar2[1] = uVar4;
    ::vk::flushMappedMemoryRange
              (vk,pVVar15,
               (VkDeviceMemory)
               ((vertexBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (vertexBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
    pAVar6 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    size = local_450;
    memset((resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr,0,local_450);
    ::vk::flushMappedMemoryRange
              (vk,pVVar15,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,size);
    beginCommandBuffer(vk,local_448.m_data.object);
    beginRenderPassWithRasterizationDisabled
              (vk,local_448.m_data.object,(VkRenderPass)local_398.m_data.object.m_internal,
               (VkFramebuffer)local_278.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_448.m_data.object,0,local_2b8.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x56])
              (vk,local_448.m_data.object,0,local_338.m_data.object.m_internal,0,1,&local_418,0,0);
    vertexBufferOffset = 0;
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,local_448.m_data.object,0,1,&vertexBuffer,
               (VkBufferMemoryBarrier *)&vertexBufferOffset);
    (*vk->_vptr_DeviceInterface[0x59])(vk,local_448.m_data.object,6,1,0,0);
    endRenderPass(vk,local_448.m_data.object);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,local_450);
    iVar12 = 0;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,local_448.m_data.object,0x8000,0x4000,0,0,0,1,
               (VkBufferMemoryBarrier *)&vertexBufferOffset,0,0);
    endCommandBuffer(vk,local_448.m_data.object);
    submitCommandsAndWait(vk,pVVar15,local_370,local_448.m_data.object);
    pAVar6 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::invalidateMappedMemoryRange
              (vk,pVVar15,
               (VkDeviceMemory)
               ((resultBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,local_450);
    readInterleavedData<tcu::Vector<float,3>>
              (&vertices,(tessellation *)(ulong)*pAVar6->m_hostPtr,(int)pAVar6->m_hostPtr,
               (void *)0x10,0x10,iVar12);
    pTVar3 = pCVar14->m_testCtx->m_log;
    pcVar16 = (code *)0x0;
    pcVar11 = compareOneMinusTessCoord;
    if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
      pcVar16 = compareOneMinusTessCoord;
    }
    this_02 = (de *)vertices.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE) {
      pcVar16 = compareTessCoordRange;
    }
    for (; this_02 !=
           (de *)vertices.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 0xc) {
      lVar13 = 0;
      while( true ) {
        if (local_360 == lVar13) break;
        cVar7 = (*pcVar16)(*(undefined4 *)(this_02 + lVar13 * 4),pTVar3);
        if (cVar7 == '\0') {
          vertexBufferOffset = (VkDeviceSize)pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_220);
          std::operator<<((ostream *)&uStack_220,"Note: got a wrong tessellation coordinate ");
          if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
            de::toString<tcu::Vector<float,3>>(&local_3d8,this_02,value);
          }
          else {
            local_2f0._M_dataplus._M_p = *(pointer *)this_02;
            de::toString<tcu::Vector<float,2>>
                      (&local_3d8,(de *)&local_2f0,(Vector<float,_2> *)value);
          }
          std::operator<<((ostream *)&uStack_220,(string *)&local_3d8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&vertexBufferOffset,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_220);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexBufferOffset,"Invalid tessellation coordinate component",
                     (allocator<char> *)&local_3d8);
          tcu::TestStatus::fail((TestStatus *)local_58,(string *)&vertexBufferOffset);
          std::__cxx11::string::~string((string *)(local_58 + 8));
          std::__cxx11::string::~string((string *)&vertexBufferOffset);
        }
        lVar13 = lVar13 + 1;
      }
    }
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&vertices.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
    lVar13 = local_368 + 1;
    vk = local_420;
    pCVar14 = local_428;
    pVVar15 = local_458;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexBufferOffset,"OK",(allocator<char> *)&local_3d8);
  pTVar5 = local_378;
  tcu::TestStatus::pass(local_378,(string *)&vertexBufferOffset);
  std::__cxx11::string::~string((string *)&vertexBufferOffset);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2b8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_448);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_298);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_338);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_278);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_398);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_418);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&local_358);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_318);
  tessellation::Buffer::~Buffer(&resultBuffer);
  tessellation::Buffer::~Buffer(&vertexBuffer);
  std::_Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
  ~_Vector_base(&tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               );
  return pTVar5;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const int						numTessLevelCases	= 32;
	const std::vector<TessLevels>	tessLevelCases		= genTessLevelCases(numTessLevelCases);

	int maxNumVerticesInDrawCall = 0;
	for (int i = 0; i < numTessLevelCases; ++i)
		maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode,
										   &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]));

	// We may get more invocations than expected, so add some more space (arbitrary number).
	maxNumVerticesInDrawCall += 4;

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat		vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32		vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize	vertexDataSizeBytes = NUM_TESS_LEVELS * vertexStride;
	const Buffer		vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(vertexDataSizeBytes == sizeof(TessLevels));

	// Output buffer: number of invocations and array of tess coords

	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + maxNumVerticesInDrawCall * sizeof(tcu::Vec4);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; ++tessLevelCaseNdx)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Testing with tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], caseDef.primitiveType)
			<< tcu::TestLog::EndMessage;

		{
			const Allocation& alloc = vertexBuffer.getAllocation();
			deMemcpy(alloc.getHostPtr(), &tessLevelCases[tessLevelCaseNdx], sizeof(TessLevels));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, NUM_TESS_LEVELS, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify case result
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32				 numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3> vertices    = readInterleavedData<tcu::Vec3>(numVertices, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));

			// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
			DE_ASSERT(numVertices <= maxNumVerticesInDrawCall);

			tcu::TestLog& log           = context.getTestContext().getLog();
			const int     numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			CompareFunc compare = (caseDef.caseType == CASETYPE_TESS_COORD_RANGE     ? compareTessCoordRange :
								   caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD ? compareOneMinusTessCoord : DE_NULL);

			DE_ASSERT(compare != DE_NULL);

			for (std::vector<tcu::Vec3>::const_iterator vertexIter = vertices.begin(); vertexIter != vertices.end(); ++vertexIter)
			for (int i = 0; i < numComponents; ++i)
				if (!compare(log, (*vertexIter)[i]))
				{
						log << tcu::TestLog::Message << "Note: got a wrong tessellation coordinate "
							<< (numComponents == 3 ? de::toString(*vertexIter) : de::toString(vertexIter->swizzle(0,1))) << tcu::TestLog::EndMessage;

						tcu::TestStatus::fail("Invalid tessellation coordinate component");
				}
		}
	}
	return tcu::TestStatus::pass("OK");
}